

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mnemonic.c
# Opt level: O1

char * mnemonic_from_bytes(words *w,uchar *bytes,size_t bytes_len)

{
  ulong uVar1;
  char **ppcVar2;
  ulong uVar3;
  size_t sVar4;
  char *pcVar5;
  size_t sVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  char *pcVar11;
  char *__dest;
  size_t size;
  
  uVar10 = bytes_len << 3;
  uVar1 = w->bits;
  size = 0;
  if (uVar1 <= uVar10) {
    ppcVar2 = w->indices;
    uVar9 = 0;
    size = 0;
    do {
      uVar3 = uVar9 * uVar1;
      if (uVar3 < uVar3 + uVar1) {
        lVar7 = 0;
        uVar8 = uVar1;
        do {
          lVar7 = (ulong)((bytes[uVar3 >> 3] >> (~(byte)uVar3 & 7) & 1) != 0) + lVar7 * 2;
          uVar3 = uVar3 + 1;
          uVar8 = uVar8 - 1;
        } while (uVar8 != 0);
      }
      else {
        lVar7 = 0;
      }
      sVar4 = strlen(ppcVar2[lVar7]);
      size = size + sVar4 + 1;
      uVar9 = uVar9 + 1;
    } while (uVar9 < uVar10 / uVar1);
  }
  if ((size == 0) || (pcVar5 = (char *)wally_malloc(size), pcVar5 == (char *)0x0)) {
    pcVar5 = (char *)0x0;
  }
  else {
    if (uVar1 <= uVar10) {
      uVar9 = 0;
      __dest = pcVar5;
      do {
        sVar6 = w->bits;
        uVar3 = sVar6 * uVar9;
        if (uVar3 < uVar3 + sVar6) {
          lVar7 = 0;
          do {
            lVar7 = (ulong)((bytes[uVar3 >> 3] >> (~(byte)uVar3 & 7) & 1) != 0) + lVar7 * 2;
            uVar3 = uVar3 + 1;
            sVar6 = sVar6 - 1;
          } while (sVar6 != 0);
        }
        else {
          lVar7 = 0;
        }
        pcVar11 = w->indices[lVar7];
        sVar4 = strlen(pcVar11);
        memcpy(__dest,pcVar11,sVar4);
        pcVar11 = __dest + sVar4;
        __dest = pcVar11 + 1;
        *pcVar11 = ' ';
        uVar9 = uVar9 + 1;
      } while (uVar9 < uVar10 / uVar1);
    }
    pcVar5[size - 1] = '\0';
  }
  return pcVar5;
}

Assistant:

char *mnemonic_from_bytes(const struct words *w, const unsigned char *bytes, size_t bytes_len)
{
    size_t total_bits = bytes_len * 8u; /* bits in 'bytes' */
    size_t total_mnemonics = total_bits / w->bits; /* Mnemonics in 'bytes' */
    size_t i, str_len = 0;
    char *str = NULL;

    /* Compute length of result */
    for (i = 0; i < total_mnemonics; ++i) {
        size_t idx = extract_index(w->bits, bytes, i);
        size_t mnemonic_len = strlen(w->indices[idx]);

        str_len += mnemonic_len + 1; /* +1 for following separator or NUL */
    }

    /* Allocate and fill result */
    if (str_len && (str = wally_malloc(str_len))) {
        char *out = str;

        for (i = 0; i < total_mnemonics; ++i) {
            size_t idx = extract_index(w->bits, bytes, i);
            size_t mnemonic_len = strlen(w->indices[idx]);

            memcpy(out, w->indices[idx], mnemonic_len);
            out[mnemonic_len] = ' '; /* separator */
            out += mnemonic_len + 1;
        }
        str[str_len - 1] = '\0'; /* Overwrite the last separator with NUL */
    }

    return str;
}